

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmViewPosition::Write(ON_3dmViewPosition *this,ON_BinaryArchive *file)

{
  int iVar1;
  bool local_1d;
  int i;
  bool rc;
  int minor_version;
  ON_BinaryArchive *file_local;
  ON_3dmViewPosition *this_local;
  
  iVar1 = ON_BinaryArchive::Archive3dmVersion(file);
  local_1d = ON_BinaryArchive::Write3dmChunkVersion(file,1,(uint)(4 < iVar1));
  if (local_1d) {
    if (local_1d) {
      local_1d = ON_BinaryArchive::WriteInt(file,(uint)((this->m_bMaximized & 1U) != 0));
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_wnd_left);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_wnd_right);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_wnd_top);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_wnd_bottom);
    }
    if ((4 < iVar1 != 0) && (local_1d != false)) {
      local_1d = ON_BinaryArchive::WriteChar(file,this->m_floating_viewport);
    }
  }
  return local_1d;
}

Assistant:

bool ON_3dmViewPosition::Write( ON_BinaryArchive& file ) const
{
  int minor_version =  ( file.Archive3dmVersion() >= 5 ) ? 1 : 0;

  bool rc = file.Write3dmChunkVersion(1,minor_version);
  if (rc) 
  {
    int i = m_bMaximized ? 1 : 0;
    if (rc) rc = file.WriteInt( i );
    if (rc) rc = file.WriteDouble( m_wnd_left );
    if (rc) rc = file.WriteDouble( m_wnd_right );
    if (rc) rc = file.WriteDouble( m_wnd_top );
    if (rc) rc = file.WriteDouble( m_wnd_bottom );

    if ( minor_version >= 1 )
    {
      // 13 March 2009 S. Baer
      // version 1.1 added support for m_floating_viewport
      // in V5 files.  This info is not in V4 files because
      // they might use this to write userdata.
      if (rc) rc = file.WriteChar( m_floating_viewport );
    }
  }
  return rc;
}